

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O3

void __thiscall Reducer::visitModule(Reducer *this,Module *curr)

{
  undefined8 *puVar1;
  Module *pMVar2;
  pointer puVar3;
  __uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> __args;
  size_t sVar4;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *puVar5;
  long *plVar6;
  Expression *parent;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  pointer pEVar12;
  bool bVar13;
  Index IVar14;
  ostream *poVar15;
  long lVar16;
  size_t *psVar17;
  __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
  _Var18;
  Type TVar19;
  int *piVar20;
  int iVar21;
  Index IVar22;
  ulong uVar23;
  HeapType HVar24;
  long lVar25;
  Index index;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  pointer puVar26;
  ulong uVar27;
  Name NVar28;
  Name NVar29;
  Signature SVar30;
  Export exp_2;
  undefined1 auStack_b8 [8];
  ProgramResult result;
  pointer local_80;
  pointer pEStack_78;
  vector<wasm::Export,_std::allocator<wasm::Export>_> exports;
  HeapType HStack_58;
  vector<wasm::Export,_std::allocator<wasm::Export>_> currExports;
  ulong local_38;
  
  if ((this->module)._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
      _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl != curr) {
    __assert_fail("curr == module.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp"
                  ,0x3a9,"void Reducer::visitModule(Module *)");
  }
  do {
    bVar13 = reduceFunctions(this);
  } while (bVar13);
  shrinkElementSegments(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"|    try to remove exports (with factor ",0x28);
  poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->factor);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,")\n",2);
  pEStack_78 = (pointer)0x0;
  exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar2 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  puVar26 = *(pointer *)
             &(pMVar2->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ;
  puVar3 = *(pointer *)
            ((long)&(pMVar2->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            + 8);
  if (puVar26 != puVar3) {
    do {
      __args.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
           (puVar26->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>;
      if (exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_start ==
          exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Export,std::allocator<wasm::Export>>::
        _M_realloc_insert<wasm::Export_const&>
                  ((vector<wasm::Export,std::allocator<wasm::Export>> *)&pEStack_78,
                   (iterator)
                   exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (Export *)
                   __args.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                   _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
      }
      else {
        *(undefined8 *)
         &(exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
           super__Vector_impl_data._M_start)->kind =
             *(undefined8 *)
              ((long)__args.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                     _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                     .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x20);
        sVar4 = *(size_t *)
                 __args.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
                 .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        pcVar8 = *(char **)((long)__args.
                                  super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                  .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 8);
        pcVar9 = *(char **)((long)__args.
                                  super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                  .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x18)
        ;
        ((exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_start)->value).super_IString.str._M_len =
             (((Name *)((long)__args.
                              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                              .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x10))->
             super_IString).str._M_len;
        ((exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_start)->value).super_IString.str._M_str = pcVar9;
        ((exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_start)->name).super_IString.str._M_len = sVar4;
        ((exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_start)->name).super_IString.str._M_str = pcVar8;
        exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
        super__Vector_impl_data._M_start =
             exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      puVar26 = puVar26 + 1;
    } while (puVar26 != puVar3);
    if (exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
        super__Vector_impl_data._M_start != pEStack_78) {
      uVar27 = 0;
      local_38 = 1;
      do {
        iVar21 = this->factor / 100;
        if (iVar21 < 1000) {
          iVar21 = 999;
        }
        bVar13 = shouldTryToReduce(this,(ulong)(iVar21 + 1));
        if (bVar13) {
          HStack_58.id = 0;
          currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (local_38 != 0) {
            lVar25 = uVar27 * 0x28;
            uVar23 = uVar27 - 1;
            do {
              uVar23 = uVar23 + 1;
              if ((ulong)(((long)exports.
                                 super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                                 _M_impl.super__Vector_impl_data._M_start - (long)pEStack_78 >> 3) *
                         -0x3333333333333333) <= uVar23) break;
              result.output.field_2._M_allocated_capacity =
                   *(size_type *)((long)&pEStack_78->kind + lVar25);
              puVar1 = (undefined8 *)((long)&(pEStack_78->name).super_IString.str._M_len + lVar25);
              auStack_b8 = (undefined1  [8])*puVar1;
              result._0_8_ = puVar1[1];
              puVar1 = (undefined8 *)((long)&(pEStack_78->value).super_IString.str._M_len + lVar25);
              result.output._M_dataplus._M_p = (pointer)*puVar1;
              result.output._M_string_length = puVar1[1];
              NVar28.super_IString.str._M_str = (char *)auStack_b8;
              NVar28.super_IString.str._M_len =
                   (size_t)(this->module)._M_t.
                           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>
                           .super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
              lVar16 = wasm::Module::getExportOrNull(NVar28);
              if (lVar16 != 0) {
                if (currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
                    currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  std::vector<wasm::Export,std::allocator<wasm::Export>>::
                  _M_realloc_insert<wasm::Export_const&>
                            ((vector<wasm::Export,std::allocator<wasm::Export>> *)&HStack_58,
                             (iterator)
                             currExports.
                             super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl
                             .super__Vector_impl_data._M_start,(Export *)auStack_b8);
                }
                else {
                  *(size_type *)
                   &(currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                     _M_impl.super__Vector_impl_data._M_start)->kind =
                       result.output.field_2._M_allocated_capacity;
                  ((currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                    _M_impl.super__Vector_impl_data._M_start)->value).super_IString.str._M_len =
                       (size_t)result.output._M_dataplus._M_p;
                  ((currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                    _M_impl.super__Vector_impl_data._M_start)->value).super_IString.str._M_str =
                       (char *)result.output._M_string_length;
                  ((currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                    _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str._M_len =
                       (size_t)auStack_b8;
                  ((currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                    _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str._M_str =
                       (char *)result._0_8_;
                  currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1;
                }
                NVar29.super_IString.str._M_str = (char *)auStack_b8;
                NVar29.super_IString.str._M_len =
                     (size_t)(this->module)._M_t.
                             super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>
                             .super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
                wasm::Module::removeExport(NVar29);
              }
              lVar25 = lVar25 + 0x28;
            } while ((ulong)(((long)((long)currExports.
                                           super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>
                                           ._M_impl.super__Vector_impl_data._M_start - HStack_58.id)
                             >> 3) * -0x3333333333333333) < local_38);
          }
          result._0_8_ = &result.output._M_string_length;
          result.output._M_dataplus._M_p = (pointer)0x0;
          result.output._M_string_length = result.output._M_string_length & 0xffffffffffffff00;
          bVar13 = writeAndTestReduction(this,(ProgramResult *)auStack_b8);
          pEVar12 = currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          HVar24.id = HStack_58.id;
          if (bVar13) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"|      removed ",0xf);
            poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," exports\n",9);
            noteReduction(this,((long)((long)currExports.
                                             super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>
                                             ._M_impl.super__Vector_impl_data._M_start -
                                      HStack_58.id) >> 3) * -0x3333333333333333);
            uVar27 = uVar27 + local_38;
            local_38 = local_38 * 2;
            if ((ulong)(long)this->factor <= local_38) {
              local_38 = (long)this->factor;
            }
          }
          else {
            for (; (pointer)HVar24.id != pEVar12; HVar24.id = (uintptr_t)(HVar24.id + 0x28)) {
              sVar4 = *(size_t *)&((pointer)HVar24.id)->kind;
              sVar10 = (((pointer)HVar24.id)->name).super_IString.str._M_len;
              pcVar8 = (((pointer)HVar24.id)->name).super_IString.str._M_str;
              sVar11 = (((pointer)HVar24.id)->value).super_IString.str._M_len;
              pcVar9 = (((pointer)HVar24.id)->value).super_IString.str._M_str;
              pMVar2 = (this->module)._M_t.
                       super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                       super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
              psVar17 = (size_t *)operator_new(0x28);
              psVar17[4] = sVar4;
              psVar17[2] = sVar11;
              psVar17[3] = (size_t)pcVar9;
              *psVar17 = sVar10;
              psVar17[1] = (size_t)pcVar8;
              wasm::Module::addExport((Export *)pMVar2);
            }
            bVar13 = local_38 < 2;
            local_38 = local_38 >> 1;
            if (bVar13) {
              local_38 = 1;
            }
          }
          if ((size_type *)result._0_8_ != &result.output._M_string_length) {
            operator_delete((void *)result._0_8_,result.output._M_string_length + 1);
          }
          if ((pointer)HStack_58.id != (pointer)0x0) {
            operator_delete((void *)HStack_58.id,
                            (long)currExports.
                                  super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - HStack_58.id);
          }
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 < (ulong)(((long)exports.
                                       super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)pEStack_78
                                >> 3) * -0x3333333333333333));
    }
  }
  pMVar2 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  puVar5 = *(pointer *)
            ((long)&(pMVar2->elementSegments).
                    super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            + 8);
  _Var18 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>*,std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>>,__gnu_cxx::__ops::_Iter_negate<Reducer::visitModule(wasm::Module*)::_lambda(auto:1&)_1_>>
                     (*(undefined8 *)
                       &(pMVar2->elementSegments).
                        super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                        ._M_impl,puVar5);
  pMVar2 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  plVar6 = *(long **)&(pMVar2->functions).
                      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                      ._M_impl;
  if (((((long)*(pointer *)
                ((long)&(pMVar2->functions).
                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                + 8) - (long)plVar6 == 8) && (_Var18._M_current == puVar5)) &&
      (*(pointer *)
        &(pMVar2->exports).
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       == *(pointer *)
           ((long)&(pMVar2->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           + 8))) && (lVar25 = *plVar6, *(long *)(lVar25 + 0x20) == 0)) {
    parent = *(Expression **)(lVar25 + 0x60);
    if (((0x31 < (ulong)parent->_id) || ((0x200000000000aU >> ((ulong)parent->_id & 0x3f) & 1) == 0)
        ) || (parent[1].type.id == 0)) {
      uVar7 = *(undefined8 *)(lVar25 + 0x38);
      wasm::AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                ((AbstractChildIterator<wasm::ChildIterator> *)auStack_b8,parent);
      IVar22 = (int)((ulong)((long)result.time - result.output.field_2._8_8_) >> 3) +
               auStack_b8._0_4_;
      if (IVar22 != 0) {
        index = 0;
        do {
          IVar14 = wasm::AbstractChildIterator<wasm::ChildIterator>::mapIndex
                             ((AbstractChildIterator<wasm::ChildIterator> *)auStack_b8,index);
          piVar20 = (int *)(result.output.field_2._8_8_ + -0x20 + (ulong)IVar14 * 8);
          if (IVar14 < 4) {
            piVar20 = &result.code + (ulong)IVar14 * 2;
          }
          lVar16 = **(long **)piVar20;
          if (*(long *)(lVar16 + 8) != 1) {
            TVar19.id = wasm::HeapType::getSignature();
            SVar30.results.id = *(uintptr_t *)(lVar16 + 8);
            SVar30.params.id = TVar19.id;
            wasm::HeapType::HeapType(&HStack_58,SVar30);
            *(uintptr_t *)(lVar25 + 0x38) = HStack_58.id;
            *(long *)(lVar25 + 0x60) = lVar16;
            bVar13 = writeAndTestReduction(this);
            if (bVar13) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"|    altered function result type\n",0x22);
              noteReduction(this,1);
              break;
            }
            *(undefined8 *)(lVar25 + 0x38) = uVar7;
            *(Expression **)(lVar25 + 0x60) = parent;
          }
          index = index + 1;
        } while (IVar22 != index);
      }
      if (result.output.field_2._8_8_ != 0) {
        operator_delete((void *)result.output.field_2._8_8_,
                        (long)local_80 - result.output.field_2._8_8_);
      }
    }
  }
  if (pEStack_78 != (pointer)0x0) {
    operator_delete(pEStack_78,
                    (long)exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pEStack_78);
  }
  return;
}

Assistant:

void visitModule(Module* curr) {
    // The initial module given to us is our global object. As we continue to
    // process things here, we may replace the module, so we should never again
    // refer to curr.
    assert(curr == module.get());
    curr = nullptr;

    // Reduction of entire functions at a time is very effective, and we do it
    // with exponential growth and backoff, so keep doing it while it works.
    while (reduceFunctions()) {
    }

    shrinkElementSegments();

    // try to remove exports
    std::cerr << "|    try to remove exports (with factor " << factor << ")\n";
    std::vector<Export> exports;
    for (auto& exp : module->exports) {
      exports.push_back(*exp);
    }
    size_t skip = 1;
    for (size_t i = 0; i < exports.size(); i++) {
      if (!shouldTryToReduce(std::max((factor / 100) + 1, 1000))) {
        continue;
      }
      std::vector<Export> currExports;
      for (size_t j = 0; currExports.size() < skip && i + j < exports.size();
           j++) {
        auto exp = exports[i + j];
        if (module->getExportOrNull(exp.name)) {
          currExports.push_back(exp);
          module->removeExport(exp.name);
        }
      }
      ProgramResult result;
      if (!writeAndTestReduction(result)) {
        for (auto exp : currExports) {
          module->addExport(new Export(exp));
        }
        skip = std::max(skip / 2, size_t(1)); // or 1?
      } else {
        std::cerr << "|      removed " << currExports.size() << " exports\n";
        noteReduction(currExports.size());
        i += skip;
        skip = std::min(size_t(factor), 2 * skip);
      }
    }
    // If we are left with a single function that is not exported or used in
    // a table, that is useful as then we can change the return type.
    bool allTablesEmpty =
      std::all_of(module->elementSegments.begin(),
                  module->elementSegments.end(),
                  [&](auto& segment) { return segment->data.empty(); });

    if (module->functions.size() == 1 && module->exports.empty() &&
        allTablesEmpty) {
      auto* func = module->functions[0].get();
      // We can't remove something that might have breaks to it.
      if (!func->imported() && !Properties::isNamedControlFlow(func->body)) {
        auto funcType = func->type;
        auto* funcBody = func->body;
        for (auto* child : ChildIterator(func->body)) {
          if (!(child->type.isConcrete() || child->type == Type::none)) {
            continue; // not something a function can return
          }
          // Try to replace the body with the child, fixing up the function
          // to accept it.
          func->type = Signature(funcType.getSignature().params, child->type);
          func->body = child;
          if (writeAndTestReduction()) {
            // great, we succeeded!
            std::cerr << "|    altered function result type\n";
            noteReduction(1);
            break;
          }
          // Undo.
          func->type = funcType;
          func->body = funcBody;
        }
      }
    }
  }